

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void CreateETandAET(int count,QPoint *pts,EdgeTable *ET,EdgeTableEntry *AET,EdgeTableEntry *pETEs,
                   ScanLineListBlock *pSLLBlock)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RCX;
  EdgeTableEntry *pEVar5;
  int *in_RDX;
  EdgeTableEntry *in_RSI;
  int in_EDI;
  int *in_R8;
  long in_R9;
  long in_FS_OFFSET;
  int dx;
  int dy;
  QPoint *CurrPt;
  QPoint *PrevPt;
  QPoint *bottom;
  QPoint *top;
  int iSLLBlock;
  EdgeTableEntry *pEVar6;
  int scanline;
  EdgeTableEntry *ETE;
  EdgeTableEntry *ET_00;
  int *local_38;
  EdgeTableEntry *local_20;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RCX + 0x20) = 0;
  *(undefined8 *)(in_RCX + 0x28) = 0;
  *(undefined8 *)(in_RCX + 0x30) = 0;
  *(undefined4 *)(in_RCX + 8) = 0x80000000;
  in_RDX[6] = 0;
  in_RDX[7] = 0;
  *in_RDX = -0x80000000;
  in_RDX[1] = 0x7fffffff;
  *(undefined8 *)(in_R9 + 600) = 0;
  pEVar6 = (EdgeTableEntry *)(&in_RSI->ymax + (long)(in_EDI + -1) * 2);
  local_38 = in_R8;
  pEVar5 = in_RSI;
  local_18 = in_EDI;
  while (local_20 = pEVar5, iVar4 = local_18 + -1, local_18 != 0) {
    pEVar5 = (EdgeTableEntry *)&local_20->bres;
    iVar2 = QPoint::y((QPoint *)0x6581a9);
    iVar3 = QPoint::y((QPoint *)0x6581b7);
    if (iVar3 < iVar2) {
      local_38[1] = 0;
      ETE = pEVar6;
      ET_00 = local_20;
    }
    else {
      local_38[1] = 1;
      ETE = local_20;
      ET_00 = pEVar6;
    }
    iVar2 = QPoint::y((QPoint *)0x65820d);
    scanline = (int)((ulong)pEVar6 >> 0x20);
    iVar3 = QPoint::y((QPoint *)0x65821b);
    pEVar6 = local_20;
    local_18 = iVar4;
    if (iVar2 != iVar3) {
      iVar4 = QPoint::y((QPoint *)0x658233);
      *local_38 = iVar4 + -1;
      iVar2 = QPoint::y((QPoint *)0x658249);
      iVar4 = QPoint::y((QPoint *)0x658257);
      iVar2 = iVar2 - iVar4;
      iVar4 = -0x55555556;
      if (iVar2 != 0) {
        iVar4 = QPoint::x((QPoint *)0x658280);
        local_38[2] = iVar4;
        iVar4 = QPoint::x((QPoint *)0x658294);
        iVar4 = iVar4 - local_38[2];
        if (iVar4 < 0) {
          local_38[4] = iVar4 / iVar2;
          local_38[5] = local_38[4] + -1;
          local_38[6] = iVar4 * -2 + iVar2 * 2 * local_38[5];
          local_38[7] = iVar4 * -2 + iVar2 * 2 * local_38[4];
          local_38[3] = local_38[4] * 2 * iVar2 + iVar4 * -2 + iVar2 * -2;
        }
        else {
          local_38[4] = iVar4 / iVar2;
          local_38[5] = local_38[4] + 1;
          local_38[6] = iVar4 * 2 - iVar2 * 2 * local_38[5];
          local_38[7] = iVar4 * 2 - iVar2 * 2 * local_38[4];
          local_38[3] = local_38[4] * -2 * iVar2 + iVar4 * 2;
        }
      }
      QPoint::y((QPoint *)0x6583e4);
      InsertEdgeInET((EdgeTable *)ET_00,ETE,scanline,(ScanLineListBlock **)local_20,
                     (int *)CONCAT44(iVar2,iVar4));
      iVar4 = QPoint::y((QPoint *)0x658409);
      if (*in_RDX < iVar4) {
        iVar4 = QPoint::y((QPoint *)0x65841c);
        *in_RDX = iVar4;
      }
      iVar4 = QPoint::y((QPoint *)0x65842f);
      if (iVar4 < in_RDX[1]) {
        iVar4 = QPoint::y((QPoint *)0x658443);
        in_RDX[1] = iVar4;
      }
      local_38 = local_38 + 0xe;
      pEVar6 = local_20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void CreateETandAET(int count, const QPoint *pts,
                           EdgeTable *ET, EdgeTableEntry *AET, EdgeTableEntry *pETEs,
                           ScanLineListBlock *pSLLBlock)
{
    const QPoint *top,
                          *bottom,
                          *PrevPt,
                          *CurrPt;
    int iSLLBlock = 0;
    int dy;

    Q_ASSERT(count > 1);

    /*
     *  initialize the Active Edge Table
     */
    AET->next = nullptr;
    AET->back = nullptr;
    AET->nextWETE = nullptr;
    AET->bres.minor_axis = SMALL_COORDINATE;

    /*
     *  initialize the Edge Table.
     */
    ET->scanlines.next = nullptr;
    ET->ymax = SMALL_COORDINATE;
    ET->ymin = LARGE_COORDINATE;
    pSLLBlock->next = nullptr;

    PrevPt = &pts[count - 1];

    /*
     *  for each vertex in the array of points.
     *  In this loop we are dealing with two vertices at
     *  a time -- these make up one edge of the polygon.
     */
    while (count--) {
        CurrPt = pts++;

        /*
         *  find out which point is above and which is below.
         */
        if (PrevPt->y() > CurrPt->y()) {
            bottom = PrevPt;
            top = CurrPt;
            pETEs->ClockWise = 0;
        } else {
            bottom = CurrPt;
            top = PrevPt;
            pETEs->ClockWise = 1;
        }

        /*
         * don't add horizontal edges to the Edge table.
         */
        if (bottom->y() != top->y()) {
            pETEs->ymax = bottom->y() - 1;  /* -1 so we don't get last scanline */

            /*
             *  initialize integer edge algorithm
             */
            dy = bottom->y() - top->y();
            BRESINITPGONSTRUCT(dy, top->x(), bottom->x(), pETEs->bres)

            InsertEdgeInET(ET, pETEs, top->y(), &pSLLBlock, &iSLLBlock);

            if (PrevPt->y() > ET->ymax)
                ET->ymax = PrevPt->y();
            if (PrevPt->y() < ET->ymin)
                ET->ymin = PrevPt->y();
            ++pETEs;
        }

        PrevPt = CurrPt;
    }
}